

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O1

CURLcode on_resp_header(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts,char *header)

{
  byte bVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  char *p;
  char *in_stack_ffffffffffffffc8;
  char *local_30;
  
  iVar4 = curl_strnequal(header,"WWW-Authenticate:",0x11);
  if (((iVar4 == 0) || ((data->req).httpcode != 0x191)) &&
     ((iVar4 = curl_strnequal(header,"Proxy-authenticate:",0x13), iVar4 == 0 ||
      ((data->req).httpcode != 0x197)))) {
    iVar4 = curl_strnequal(header,"Content-Length:",0xf);
    if (iVar4 == 0) {
      _Var3 = Curl_compareheader(header,"Connection:",0xb,"close",5);
      if (!_Var3) {
        iVar4 = curl_strnequal(header,"Transfer-Encoding:",0x12);
        if (iVar4 != 0) {
          if (99 < (data->req).httpcode - 200U) {
            _Var3 = Curl_compareheader(header,"Transfer-Encoding:",0x12,"chunked",7);
            if (!_Var3) {
              return CURLE_OK;
            }
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data,"CONNECT responded chunked");
            }
            ts->field_0xac = ts->field_0xac | 1;
            Curl_httpchunk_reset(data,&ts->ch,true);
            return CURLE_OK;
          }
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x89f & 0x40) == 0) {
            return CURLE_OK;
          }
          pcVar2 = (data->state).feat;
          if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
            return CURLE_OK;
          }
          pcVar6 = "Ignoring Transfer-Encoding in CONNECT %03d response";
          goto LAB_0011468d;
        }
        _Var3 = Curl_compareheader(header,"Proxy-Connection:",0x11,"close",5);
        if (!_Var3) {
          iVar4 = strncmp(header,"HTTP/1.",7);
          if (iVar4 != 0) {
            return CURLE_OK;
          }
          if ((header[7] & 0xfeU) != 0x30) {
            return CURLE_OK;
          }
          if (header[8] != ' ') {
            return CURLE_OK;
          }
          if (9 < (byte)(header[9] - 0x30U)) {
            return CURLE_OK;
          }
          bVar1 = header[10];
          if (9 < (byte)(bVar1 - 0x30)) {
            return CURLE_OK;
          }
          if (9 < (byte)(header[0xb] - 0x30U)) {
            return CURLE_OK;
          }
          if ((byte)(header[0xc] - 0x30U) < 10) {
            return CURLE_OK;
          }
          iVar4 = (uint)(byte)header[9] * 100 + ((uint)bVar1 + (uint)bVar1 * 4) * 2 +
                  (uint)(byte)header[0xb] + -0x14d0;
          (data->req).httpcode = iVar4;
          (data->info).httpproxycode = iVar4;
          return CURLE_OK;
        }
      }
      ts->field_0xac = ts->field_0xac | 2;
    }
    else {
      if ((data->req).httpcode - 200U < 100) {
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x89f & 0x40) == 0) {
          return CURLE_OK;
        }
        pcVar2 = (data->state).feat;
        if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
          return CURLE_OK;
        }
        pcVar6 = "Ignoring Content-Length in CONNECT %03d response";
LAB_0011468d:
        Curl_infof(data,pcVar6);
        return CURLE_OK;
      }
      local_30 = header + 0xf;
      iVar4 = Curl_str_numblanks(&local_30,&ts->cl);
      if (iVar4 != 0) {
        Curl_failf(data,"Unsupported Content-Length value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
    }
    return CURLE_OK;
  }
  iVar4 = (data->req).httpcode;
  pcVar6 = Curl_copy_header_value(in_stack_ffffffffffffffc8);
  if (pcVar6 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
    pcVar2 = (data->state).feat;
    if (pcVar2 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_00114796;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar2->log_level < 1)) goto LAB_00114796;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",header);
    }
  }
LAB_00114796:
  CVar5 = Curl_http_input_auth(data,iVar4 == 0x197,pcVar6);
  (*Curl_cfree)(pcVar6);
  return CVar5;
}

Assistant:

static CURLcode on_resp_header(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               struct h1_tunnel_state *ts,
                               const char *header)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  (void)cf;

  if((checkprefix("WWW-Authenticate:", header) &&
      (401 == k->httpcode)) ||
     (checkprefix("Proxy-authenticate:", header) &&
      (407 == k->httpcode))) {

    bool proxy = (k->httpcode == 407);
    char *auth = Curl_copy_header_value(header);
    if(!auth)
      return CURLE_OUT_OF_MEMORY;

    CURL_TRC_CF(data, cf, "CONNECT: fwd auth header '%s'", header);
    result = Curl_http_input_auth(data, proxy, auth);

    free(auth);

    if(result)
      return result;
  }
  else if(checkprefix("Content-Length:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Content-Length in CONNECT %03d response",
            k->httpcode);
    }
    else {
      const char *p = header + strlen("Content-Length:");
      if(Curl_str_numblanks(&p, &ts->cl)) {
        failf(data, "Unsupported Content-Length value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Connection:"), STRCONST("close")))
    ts->close_connection = TRUE;
  else if(checkprefix("Transfer-Encoding:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Transfer-Encoding in "
            "CONNECT %03d response", k->httpcode);
    }
    else if(Curl_compareheader(header,
                               STRCONST("Transfer-Encoding:"),
                               STRCONST("chunked"))) {
      infof(data, "CONNECT responded chunked");
      ts->chunked_encoding = TRUE;
      /* reset our chunky engine */
      Curl_httpchunk_reset(data, &ts->ch, TRUE);
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Proxy-Connection:"),
                             STRCONST("close")))
    ts->close_connection = TRUE;
  else if(!strncmp(header, "HTTP/1.", 7) &&
          ((header[7] == '0') || (header[7] == '1')) &&
          (header[8] == ' ') &&
          ISDIGIT(header[9]) && ISDIGIT(header[10]) && ISDIGIT(header[11]) &&
          !ISDIGIT(header[12])) {
    /* store the HTTP code from the proxy */
    data->info.httpproxycode =  k->httpcode = (header[9] - '0') * 100 +
      (header[10] - '0') * 10 + (header[11] - '0');
  }
  return result;
}